

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

void __thiscall
phyr::SurfaceInteraction::setShadingGeomerty
          (SurfaceInteraction *this,Vector3f *dpdus,Vector3f *dpdvs,Normal3f *dndus,Normal3f *dndvs,
          bool overridesOrientation)

{
  Normal3f *n2;
  anon_struct_128_6_d0712383_for_shadingGeom *n1;
  double dVar1;
  Shape *pSVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  Normal3<double> local_80;
  double local_68;
  double dStack_60;
  double local_58;
  Normal3<double> local_48;
  
  cross<double>(dpdus,dpdvs);
  local_48.x = local_68;
  local_48.y = dStack_60;
  local_48.z = local_58;
  normalize<double>(&local_80,&local_48);
  (this->shadingGeom).n.z = local_80.z;
  (this->shadingGeom).n.x = local_80.x;
  (this->shadingGeom).n.y = local_80.y;
  pSVar2 = this->shape;
  if ((pSVar2 != (Shape *)0x0) && (pSVar2->reverseNormals != pSVar2->transformChangesCoordSys)) {
    dVar1 = (this->shadingGeom).n.z;
    uVar3 = *(uint *)((long)&(this->shadingGeom).n.x + 4);
    uVar4 = *(undefined4 *)&(this->shadingGeom).n.y;
    uVar5 = *(uint *)((long)&(this->shadingGeom).n.y + 4);
    *(undefined4 *)&(this->shadingGeom).n.x = *(undefined4 *)&(this->shadingGeom).n.x;
    *(uint *)((long)&(this->shadingGeom).n.x + 4) = uVar3 ^ 0x80000000;
    *(undefined4 *)&(this->shadingGeom).n.y = uVar4;
    *(uint *)((long)&(this->shadingGeom).n.y + 4) = uVar5 ^ 0x80000000;
    (this->shadingGeom).n.z = -dVar1;
  }
  n1 = &this->shadingGeom;
  n2 = &(this->super_Interaction).n;
  if (overridesOrientation) {
    faceForward<double>(&local_80,n2,&n1->n);
    (this->super_Interaction).n.z = local_80.z;
    n2->x = local_80.x;
    (this->super_Interaction).n.y = local_80.y;
  }
  else {
    faceForward<double>(&local_80,&n1->n,n2);
    (this->shadingGeom).n.z = local_80.z;
    (n1->n).x = local_80.x;
    (this->shadingGeom).n.y = local_80.y;
  }
  (this->shadingGeom).dpdu.z = dpdus->z;
  dVar1 = dpdus->y;
  (this->shadingGeom).dpdu.x = dpdus->x;
  (this->shadingGeom).dpdu.y = dVar1;
  (this->shadingGeom).dpdv.z = dpdvs->z;
  dVar1 = dpdvs->y;
  (this->shadingGeom).dpdv.x = dpdvs->x;
  (this->shadingGeom).dpdv.y = dVar1;
  dVar1 = dndus->y;
  (this->shadingGeom).dndu.x = dndus->x;
  (this->shadingGeom).dndu.y = dVar1;
  (this->shadingGeom).dndu.z = dndus->z;
  dVar1 = dndvs->y;
  (this->shadingGeom).dndv.x = dndvs->x;
  (this->shadingGeom).dndv.y = dVar1;
  (this->shadingGeom).dndv.z = dndvs->z;
  (this->shadingGeom).overridesOrientation = overridesOrientation;
  return;
}

Assistant:

void SurfaceInteraction::setShadingGeomerty(const Vector3f& dpdus, const Vector3f& dpdvs,
                        const Normal3f& dndus, const Normal3f& dndvs,
                        bool overridesOrientation) {
    shadingGeom.n = normalize(Normal3f(cross(dpdus, dpdvs)));

    // Check if normal needs to be flipped
    if (shape && (shape->reverseNormals ^ shape->transformChangesCoordSys))
        shadingGeom.n = -shadingGeom.n;
    if (overridesOrientation) {
        // Shading normal has higher priority.
        // Flip true geometry normal to align with shading normal
        n = faceForward(n, shadingGeom.n);
    } else {
        // True geometry normal has higher priority.
        // Flip shading normal to align with true geometry normal
        shadingGeom.n = faceForward(shadingGeom.n, n);
    }

    shadingGeom.dpdu = dpdus; shadingGeom.dpdv = dpdvs;
    shadingGeom.dndu = dndus; shadingGeom.dndv = dndvs;
    shadingGeom.overridesOrientation = overridesOrientation;
}